

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<long_double>_>::SolveSSOR
          (TPZMatrix<std::complex<long_double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<long_double>_> *F,TPZFMatrix<std::complex<long_double>_> *result,
          TPZFMatrix<std::complex<long_double>_> *residual,
          TPZFMatrix<std::complex<long_double>_> *scratch,REAL overrelax,REAL *tol,int FromCurrent)

{
  TPZFMatrix<std::complex<long_double>_> *pTVar1;
  ulong uVar2;
  double local_78 [2];
  long *local_68;
  REAL local_60;
  TPZFMatrix<std::complex<long_double>_> *local_58;
  TPZFMatrix<std::complex<long_double>_> *local_50;
  TPZFMatrix<std::complex<long_double>_> *local_48;
  TPZFMatrix<std::complex<long_double>_> *local_40;
  long local_38;
  
  uVar2 = (ulong)(uint)FromCurrent;
  local_78[0] = *tol + *tol + 1.0;
  local_68 = numiterations;
  local_60 = overrelax;
  local_58 = F;
  local_50 = result;
  local_48 = residual;
  local_40 = scratch;
  for (local_38 = 0; pTVar1 = local_40, local_38 < *local_68; local_38 = local_38 + 1) {
    if (ABS(local_78[0]) <= ABS(*tol)) break;
    local_78[1] = 4.94065645841247e-324;
    local_78[0] = *tol;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x37])
              (local_60,this,local_78 + 1,F,result,residual,local_40,local_78,uVar2,1);
    local_78[1] = 4.94065645841247e-324;
    local_78[0] = *tol;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x37])
              (local_60,this,local_78 + 1,F,result,residual,pTVar1,local_78,1,0xffffffffffffffff);
    uVar2 = 1;
  }
  *local_68 = local_38;
  *tol = local_78[0];
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSSOR(int64_t &numiterations, const TPZFMatrix<TVar> &F,
						  TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, const REAL overrelax,
						  REAL &tol,const int FromCurrent) {
	REAL res = tol*2.+1.;
	int64_t i, one = 1;
	int fromcurrent = FromCurrent;
	for(i=0; i<numiterations && fabs(res) > fabs(tol); i++) {
		one = 1;
		res = tol;
		SolveSOR(one,F,result,residual,scratch,overrelax,res,fromcurrent,1);
		one = 1;
		res = tol;
		fromcurrent = 1;
		SolveSOR(one,F,result,residual,scratch,overrelax,res,fromcurrent,-1);
		//                cout << "SSOR iter = " << i <<  " res = " << res << endl;
	}
	numiterations = i;
	tol = res;
}